

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O3

bool __thiscall
draco::SequentialAttributeDecoder::DecodePortableAttribute
          (SequentialAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  bool bVar1;
  int iVar2;
  
  if ((this->attribute_->super_GeometryAttribute).num_components_ != '\0') {
    bVar1 = PointAttribute::Reset
                      (this->attribute_,
                       (long)(point_ids->
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(point_ids->
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 2);
    if (bVar1) {
      iVar2 = (*this->_vptr_SequentialAttributeDecoder[8])(this,point_ids,in_buffer);
      return SUB41(iVar2,0);
    }
  }
  return false;
}

Assistant:

bool SequentialAttributeDecoder::DecodePortableAttribute(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  if (attribute_->num_components() <= 0 ||
      !attribute_->Reset(point_ids.size())) {
    return false;
  }
  if (!DecodeValues(point_ids, in_buffer)) {
    return false;
  }
  return true;
}